

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall
cmFindPackageCommand::SetModuleVariables
          (cmFindPackageCommand *this,string *components,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
          *componentVarDefs)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  *this_00;
  bool bVar1;
  reference var;
  ulong uVar2;
  string_view sVar3;
  string local_378;
  size_t local_358;
  char *pcStack_350;
  string local_348;
  size_t local_328;
  char *pcStack_320;
  string local_318;
  string_view local_2f8;
  undefined1 local_2e8 [8];
  string id;
  string_view local_2a8;
  string local_298;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  local_278;
  string_view local_258;
  undefined1 local_248 [8];
  string prefix_1;
  undefined1 local_200 [8];
  string exact;
  string_view local_1c0;
  undefined1 local_1b0 [8];
  string prefix;
  anon_class_8_1_8991fb9c addDefinition;
  undefined1 local_178 [8];
  string req_1;
  undefined1 local_138 [8];
  string req;
  undefined1 local_f0 [8];
  string quietly;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  *varDef;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  *__range1;
  undefined1 local_90 [8];
  string components_var;
  allocator<char> local_49;
  string local_48;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  *local_28;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  *componentVarDefs_local;
  string *components_local;
  cmFindPackageCommand *this_local;
  
  local_28 = componentVarDefs;
  componentVarDefs_local =
       (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
        *)components;
  components_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CMAKE_FIND_PACKAGE_NAME",&local_49);
  sVar3 = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->Name);
  components_var.field_2._8_8_ = sVar3._M_len;
  AddFindDefinition(this,&local_48,sVar3);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 &this->Name,"_FIND_COMPONENTS");
  sVar3 = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)componentVarDefs_local)
  ;
  AddFindDefinition(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_90,sVar3);
  this_00 = local_28;
  __end1 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
           ::begin(local_28);
  varDef = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
            *)std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
              ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_>
                                *)&varDef);
    if (!bVar1) break;
    var = __gnu_cxx::
          __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_>
          ::operator*(&__end1);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)((long)&quietly.field_2 + 8),
               var->second);
    AddFindDefinition(this,&var->first,stack0xffffffffffffff30);
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_>
    ::operator++(&__end1);
  }
  if ((this->Quiet & 1U) != 0) {
    cmStrCat<std::__cxx11::string&,char_const(&)[14]>
              ((string *)local_f0,&this->Name,(char (*) [14])"_FIND_QUIETLY");
    sVar3 = (string_view)::cm::operator____s("1",1);
    req.field_2._8_8_ = sVar3._M_len;
    AddFindDefinition(this,(string *)local_f0,sVar3);
    std::__cxx11::string::~string((string *)local_f0);
  }
  if ((this->Required & 1U) != 0) {
    cmStrCat<std::__cxx11::string&,char_const(&)[15]>
              ((string *)local_138,&this->Name,(char (*) [15])"_FIND_REQUIRED");
    sVar3 = (string_view)::cm::operator____s("1",1);
    req_1.field_2._8_8_ = sVar3._M_len;
    AddFindDefinition(this,(string *)local_138,sVar3);
    std::__cxx11::string::~string((string *)local_138);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cmStrCat<std::__cxx11::string&,char_const(&)[23]>
              ((string *)local_178,&this->Name,(char (*) [23])0x1143430);
    sVar3 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)&this->VersionComplete);
    AddFindDefinition(this,(string *)local_178,sVar3);
    std::__cxx11::string::~string((string *)local_178);
  }
  prefix.field_2._8_8_ = this;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_1c0 = (string_view)::cm::operator____s("_FIND_VERSION",0xd);
    cmStrCat<std::__cxx11::string&,cm::static_string_view>
              ((string *)local_1b0,&this->Name,(static_string_view *)&local_1c0);
    std::
    function<void(std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)>
    ::
    function<cmFindPackageCommand::SetModuleVariables(std::__cxx11::string_const&,std::vector<std::pair<std::__cxx11::string,char_const*>,std::allocator<std::pair<std::__cxx11::string,char_const*>>>const&)::__0&,void>
              ((function<void(std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)>
                *)(exact.field_2._M_local_buf + 8),
               (anon_class_8_1_8991fb9c *)((long)&prefix.field_2 + 8));
    SetVersionVariables(this,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
                              *)(exact.field_2._M_local_buf + 8),(string *)local_1b0,&this->Version,
                        this->VersionCount,this->VersionMajor,this->VersionMinor,this->VersionPatch,
                        this->VersionTweak);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
    ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
                 *)((long)&exact.field_2 + 8));
    cmStrCat<std::__cxx11::string&,char_const(&)[20]>
              ((string *)local_200,&this->Name,(char (*) [20])"_FIND_VERSION_EXACT");
    if ((this->VersionExact & 1U) == 0) {
      sVar3 = (string_view)::cm::operator____s("0",1);
    }
    else {
      sVar3 = (string_view)::cm::operator____s("1",1);
    }
    prefix_1.field_2._8_8_ = sVar3._M_len;
    AddFindDefinition(this,(string *)local_200,sVar3);
    std::__cxx11::string::~string((string *)local_200);
    std::__cxx11::string::~string((string *)local_1b0);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_258 = (string_view)::cm::operator____s("_FIND_VERSION_MIN",0x11);
    cmStrCat<std::__cxx11::string&,cm::static_string_view>
              ((string *)local_248,&this->Name,(static_string_view *)&local_258);
    std::
    function<void(std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)>
    ::
    function<cmFindPackageCommand::SetModuleVariables(std::__cxx11::string_const&,std::vector<std::pair<std::__cxx11::string,char_const*>,std::allocator<std::pair<std::__cxx11::string,char_const*>>>const&)::__0&,void>
              ((function<void(std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)>
                *)&local_278,(anon_class_8_1_8991fb9c *)((long)&prefix.field_2 + 8));
    SetVersionVariables(this,&local_278,(string *)local_248,&this->Version,this->VersionCount,
                        this->VersionMajor,this->VersionMinor,this->VersionPatch,this->VersionTweak)
    ;
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
    ::~function(&local_278);
    local_2a8 = (string_view)::cm::operator____s("_FIND_VERSION_MAX",0x11);
    cmStrCat<std::__cxx11::string&,cm::static_string_view>
              (&local_298,&this->Name,(static_string_view *)&local_2a8);
    std::__cxx11::string::operator=((string *)local_248,(string *)&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::
    function<void(std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)>
    ::
    function<cmFindPackageCommand::SetModuleVariables(std::__cxx11::string_const&,std::vector<std::pair<std::__cxx11::string,char_const*>,std::allocator<std::pair<std::__cxx11::string,char_const*>>>const&)::__0&,void>
              ((function<void(std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>)>
                *)(id.field_2._M_local_buf + 8),
               (anon_class_8_1_8991fb9c *)((long)&prefix.field_2 + 8));
    SetVersionVariables(this,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
                              *)(id.field_2._M_local_buf + 8),(string *)local_248,&this->VersionMax,
                        this->VersionMaxCount,this->VersionMaxMajor,this->VersionMaxMinor,
                        this->VersionMaxPatch,this->VersionMaxTweak);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
    ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
                 *)((long)&id.field_2 + 8));
    cmStrCat<std::__cxx11::string&,char_const(&)[20]>
              ((string *)local_2e8,&this->Name,(char (*) [20])0x1143495);
    local_2f8 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)&this->VersionRange);
    AddFindDefinition(this,(string *)local_2e8,local_2f8);
    cmStrCat<std::__cxx11::string&,char_const(&)[24]>
              (&local_318,&this->Name,(char (*) [24])0x11434b0);
    std::__cxx11::string::operator=((string *)local_2e8,(string *)&local_318);
    std::__cxx11::string::~string((string *)&local_318);
    local_328 = (this->VersionRangeMin)._M_len;
    pcStack_320 = (this->VersionRangeMin)._M_str;
    AddFindDefinition(this,(string *)local_2e8,this->VersionRangeMin);
    cmStrCat<std::__cxx11::string&,char_const(&)[24]>
              (&local_348,&this->Name,(char (*) [24])0x11434cf);
    std::__cxx11::string::operator=((string *)local_2e8,(string *)&local_348);
    std::__cxx11::string::~string((string *)&local_348);
    local_358 = (this->VersionRangeMax)._M_len;
    pcStack_350 = (this->VersionRangeMax)._M_str;
    AddFindDefinition(this,(string *)local_2e8,this->VersionRangeMax);
    std::__cxx11::string::~string((string *)local_2e8);
    std::__cxx11::string::~string((string *)local_248);
  }
  if ((this->RegistryViewDefined & 1U) != 0) {
    cmStrCat<std::__cxx11::string&,char_const(&)[20]>
              (&local_378,&this->Name,(char (*) [20])"_FIND_REGISTRY_VIEW");
    sVar3 = cmWindowsRegistry::FromView((this->super_cmFindCommon).RegistryView);
    AddFindDefinition(this,&local_378,sVar3);
    std::__cxx11::string::~string((string *)&local_378);
  }
  std::__cxx11::string::~string((string *)local_90);
  return;
}

Assistant:

void cmFindPackageCommand::SetModuleVariables(
  const std::string& components,
  const std::vector<std::pair<std::string, const char*>>& componentVarDefs)
{
  this->AddFindDefinition("CMAKE_FIND_PACKAGE_NAME", this->Name);

  // Store the list of components and associated variable definitions
  std::string components_var = this->Name + "_FIND_COMPONENTS";
  this->AddFindDefinition(components_var, components);
  for (const auto& varDef : componentVarDefs) {
    this->AddFindDefinition(varDef.first, varDef.second);
  }

  if (this->Quiet) {
    // Tell the module that is about to be read that it should find
    // quietly.
    std::string quietly = cmStrCat(this->Name, "_FIND_QUIETLY");
    this->AddFindDefinition(quietly, "1"_s);
  }

  if (this->Required) {
    // Tell the module that is about to be read that it should report
    // a fatal error if the package is not found.
    std::string req = cmStrCat(this->Name, "_FIND_REQUIRED");
    this->AddFindDefinition(req, "1"_s);
  }

  if (!this->VersionComplete.empty()) {
    std::string req = cmStrCat(this->Name, "_FIND_VERSION_COMPLETE");
    this->AddFindDefinition(req, this->VersionComplete);
  }

  // Tell the module that is about to be read what version of the
  // package has been requested.
  auto addDefinition = [this](const std::string& variable,
                              cm::string_view value) {
    this->AddFindDefinition(variable, value);
  };

  if (!this->Version.empty()) {
    auto prefix = cmStrCat(this->Name, "_FIND_VERSION"_s);
    this->SetVersionVariables(addDefinition, prefix, this->Version,
                              this->VersionCount, this->VersionMajor,
                              this->VersionMinor, this->VersionPatch,
                              this->VersionTweak);

    // Tell the module whether an exact version has been requested.
    auto exact = cmStrCat(this->Name, "_FIND_VERSION_EXACT");
    this->AddFindDefinition(exact, this->VersionExact ? "1"_s : "0"_s);
  }
  if (!this->VersionRange.empty()) {
    auto prefix = cmStrCat(this->Name, "_FIND_VERSION_MIN"_s);
    this->SetVersionVariables(addDefinition, prefix, this->Version,
                              this->VersionCount, this->VersionMajor,
                              this->VersionMinor, this->VersionPatch,
                              this->VersionTweak);

    prefix = cmStrCat(this->Name, "_FIND_VERSION_MAX"_s);
    this->SetVersionVariables(addDefinition, prefix, this->VersionMax,
                              this->VersionMaxCount, this->VersionMaxMajor,
                              this->VersionMaxMinor, this->VersionMaxPatch,
                              this->VersionMaxTweak);

    auto id = cmStrCat(this->Name, "_FIND_VERSION_RANGE");
    this->AddFindDefinition(id, this->VersionRange);
    id = cmStrCat(this->Name, "_FIND_VERSION_RANGE_MIN");
    this->AddFindDefinition(id, this->VersionRangeMin);
    id = cmStrCat(this->Name, "_FIND_VERSION_RANGE_MAX");
    this->AddFindDefinition(id, this->VersionRangeMax);
  }

  if (this->RegistryViewDefined) {
    this->AddFindDefinition(cmStrCat(this->Name, "_FIND_REGISTRY_VIEW"),
                            cmWindowsRegistry::FromView(this->RegistryView));
  }
}